

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O1

void * duckdb_je_bootstrap_calloc(size_t num,size_t size)

{
  void *pvVar1;
  undefined8 uStack_8;
  
  uStack_8 = num * size;
  if (uStack_8 == 0) {
    uStack_8 = 1;
  }
  pvVar1 = a0ialloc(uStack_8,true,false);
  return pvVar1;
}

Assistant:

void *
bootstrap_calloc(size_t num, size_t size) {
	size_t num_size;

	num_size = num * size;
	if (unlikely(num_size == 0)) {
		assert(num == 0 || size == 0);
		num_size = 1;
	}

	return a0ialloc(num_size, true, false);
}